

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

bool __thiscall
chrono::ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode>::SetValueAsString
          (ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode> *this,string *mname)

{
  element_type *peVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  long lVar3;
  pointer pCVar4;
  bool bVar5;
  int numb;
  istringstream mstream;
  uint local_1b4;
  long local_1b0 [4];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  peVar1 = (this->enummap).
           super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pCVar4 = (peVar1->
           super__Vector_base<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(peVar1->
                super__Vector_base<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionPosition_setpoint::eChSetpointMode>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4;
  if (lVar3 != 0) {
    __s2 = (mname->_M_dataplus)._M_p;
    __n = mname->_M_string_length;
    lVar3 = (lVar3 >> 3) * -0x3333333333333333;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    do {
      if (((pCVar4->name)._M_string_length == __n) &&
         ((__n == 0 || (iVar2 = bcmp(*(void **)&pCVar4->name,__s2,__n), iVar2 == 0)))) {
        *this->value_ptr = pCVar4->enumid;
        return true;
      }
      pCVar4 = pCVar4 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)mname,_S_in);
  std::istream::operator>>((istringstream *)local_1b0,(int *)&local_1b4);
  bVar5 = (abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) == 0;
  if (bVar5) {
    (*(this->super_ChEnumMapperBase)._vptr_ChEnumMapperBase[1])(this,(ulong)local_1b4);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  return bVar5;
}

Assistant:

virtual bool SetValueAsString(const std::string& mname) override {
        for (int i = 0; i < enummap->size(); ++i) {
            if (enummap->at(i).name == mname) {
                *value_ptr = enummap->at(i).enumid;
                return true;
            }
        }
        // try to find from integer:
        int numb;
        std::istringstream mstream(mname);
        mstream >> numb;
        if (mstream.fail())
            return false;

        // Set value from number
        SetValueAsInt(numb);
        return true;
    }